

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O0

void settings_tests::CheckValues(Settings *settings,string *single_val,string *list_val)

{
  bool bVar1;
  lazy_ostream *in_RDX;
  lazy_ostream *in_RSI;
  Settings *in_RDI;
  long in_FS_OFFSET;
  UniValue *item;
  vector<UniValue,_std::allocator<UniValue>_> *__range1;
  iterator __end1;
  iterator __begin1;
  SettingsValue list_value;
  SettingsValue single_value;
  undefined8 in_stack_fffffffffffffc78;
  uint uVar2;
  char *this;
  lazy_ostream *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  VType in_stack_fffffffffffffc94;
  UniValue *in_stack_fffffffffffffc98;
  UniValue *in_stack_fffffffffffffca0;
  const_string *msg;
  UniValue *in_stack_fffffffffffffca8;
  const_string *line_num;
  string *in_stack_fffffffffffffcb0;
  string *section;
  string *in_stack_fffffffffffffcb8;
  Settings *in_stack_fffffffffffffcc0;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 in_stack_fffffffffffffcef;
  undefined8 in_stack_fffffffffffffcf8;
  char *local_2d8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [64];
  char *local_280;
  undefined1 local_278 [16];
  undefined1 local_268 [64];
  UniValue *local_228;
  UniValue *local_220;
  undefined1 local_212 [32];
  allocator<char> local_1f2;
  allocator<char> local_1f1;
  undefined1 local_1f0 [216];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [152];
  undefined1 local_60 [88];
  long local_8;
  
  uVar2 = (uint)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
             (allocator<char> *)in_stack_fffffffffffffcb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
             (allocator<char> *)in_stack_fffffffffffffcb8);
  this = (char *)((ulong)uVar2 << 0x20);
  common::GetSetting(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     SUB81((ulong)in_stack_fffffffffffffcf8 >> 0x38,0),
                     SUB81((ulong)in_stack_fffffffffffffcf8 >> 0x30,0),
                     SUB81((ulong)in_stack_fffffffffffffcf8 >> 0x28,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1f2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1f1);
  this_00 = &local_118;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  UniValue::UniValue(in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,
                     (string *)in_stack_fffffffffffffc88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  __s = local_212 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,(allocator<char> *)in_RDI);
  section = (string *)local_212;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,(allocator<char> *)in_RDI);
  common::GetSettingsList
            (in_RDI,section,(string *)in_stack_fffffffffffffca8,(bool)in_stack_fffffffffffffcef);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_212);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_212 + 1));
  local_220 = (UniValue *)
              std::vector<UniValue,_std::allocator<UniValue>_>::begin
                        ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffc80);
  local_228 = (UniValue *)
              std::vector<UniValue,_std::allocator<UniValue>_>::end
                        ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffc80);
  while (bVar1 = __gnu_cxx::
                 operator==<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                           ((__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                             *)in_stack_fffffffffffffc88,
                            (__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                             *)in_stack_fffffffffffffc80), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
    operator*((__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_> *)
              this);
    UniValue::UniValue(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    UniValue::push_back((UniValue *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                        (UniValue *)in_stack_fffffffffffffc88);
    UniValue::~UniValue((UniValue *)this);
    __gnu_cxx::__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
    operator++((__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_> *)
               this);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffc88);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)this);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_RDI,(const_string *)section,(size_t)line_num,
               (const_string *)in_stack_fffffffffffffca0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc80,(char (*) [1])this);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)this);
    UniValue::write_abi_cxx11_((UniValue *)(local_1f0 + 0x20),(int)local_60,(void *)0x0,0);
    local_280 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    in_stack_fffffffffffffc88 = "single_val";
    this = "single_value.write().c_str()";
    in_stack_fffffffffffffc80 = in_RSI;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,std::__cxx11::string>
              (local_268,local_278,0x76,1,2,&local_280);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)this
              );
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)this);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_RDI,(const_string *)section,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc80,(char (*) [1])this);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)this);
    UniValue::write_abi_cxx11_((UniValue *)local_1f0,(int)local_f8,(void *)0x0,0);
    local_2d8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    in_stack_fffffffffffffc88 = "list_val";
    this = "list_value.write().c_str()";
    in_stack_fffffffffffffc80 = in_RDX;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,std::__cxx11::string>
              (local_2c0,local_2d0,0x77,1,2,&local_2d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)this
              );
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniValue::~UniValue((UniValue *)this);
  UniValue::~UniValue((UniValue *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void CheckValues(const common::Settings& settings, const std::string& single_val, const std::string& list_val)
{
    common::SettingsValue single_value = GetSetting(settings, "section", "name", false, false, false);
    common::SettingsValue list_value(common::SettingsValue::VARR);
    for (const auto& item : GetSettingsList(settings, "section", "name", false)) {
        list_value.push_back(item);
    }
    BOOST_CHECK_EQUAL(single_value.write().c_str(), single_val);
    BOOST_CHECK_EQUAL(list_value.write().c_str(), list_val);
}